

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O3

mz_bool tdefl_compress_block(tdefl_compressor *d,mz_bool static_block)

{
  mz_uint16 *pmVar1;
  mz_uint16 *pmVar2;
  char cVar3;
  byte *pbVar4;
  ushort uVar5;
  byte *pbVar6;
  mz_uint8 (*pamVar7) [288];
  long lVar8;
  mz_uint16 (*pamVar9) [288];
  uint uVar10;
  uint uVar11;
  long lVar12;
  mz_uint16 *pmVar13;
  byte *pbVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  mz_uint8 *pmVar20;
  mz_uint8 *pmVar21;
  ulong uVar22;
  ulong *puVar23;
  ulong uVar24;
  mz_uint mVar25;
  ulong uVar26;
  byte bVar27;
  byte bVar28;
  uint uVar29;
  bool bVar30;
  mz_uint8 packed_code_sizes [320];
  mz_uint8 code_sizes_to_pack [320];
  byte abStack_2b8 [320];
  byte local_178 [328];
  
  if (static_block == 0) {
    d->m_huff_count[0][0x100] = 1;
    tdefl_optimize_huffman_table(d,0,0x120,0xf,0);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,0);
    iVar16 = 0x11f;
    lVar12 = 0x9067;
    do {
      if (lVar12 - 0x8f49U < 0x102) {
        iVar16 = 0x101;
        break;
      }
      iVar16 = iVar16 + -1;
      lVar8 = lVar12 + -0x14;
      lVar12 = lVar12 + -1;
    } while (*(char *)((long)d->m_max_probes + lVar8) == '\0');
    iVar17 = 0x1f;
    lVar12 = 36999;
    do {
      if (lVar12 - 0x9069U < 2) {
        iVar17 = 1;
        break;
      }
      iVar17 = iVar17 + -1;
      lVar8 = lVar12 + -0x14;
      lVar12 = lVar12 + -1;
    } while (*(char *)((long)d->m_max_probes + lVar8) == '\0');
    memcpy(local_178,d->m_huff_code_sizes,(long)iVar16);
    memcpy(local_178 + iVar16,d->m_huff_code_sizes + 1,(long)iVar17);
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 0) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 2) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 4) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 6) = 0;
    pamVar9 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 8) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 10) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0xc) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0xe) = 0;
    pamVar9 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x10) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x12) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x14) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x16) = 0;
    pamVar9 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x18) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x1a) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x1c) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x1e) = 0;
    pamVar9 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x1e) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x20) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x22) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x24) = 0;
    if (iVar17 + iVar16 == 0) {
      uVar29 = 0;
    }
    else {
      pamVar9 = d->m_huff_count + 2;
      pmVar1 = d->m_huff_count[2] + 0x12;
      pmVar2 = d->m_huff_count[2] + 0x11;
      uVar26 = 0;
      uVar29 = 0;
      uVar18 = 0;
      uVar10 = 0;
      uVar24 = 0xff;
      do {
        bVar27 = local_178[uVar26];
        uVar22 = (ulong)bVar27;
        bVar28 = (byte)uVar24;
        if (uVar22 == 0) {
          if (uVar10 != 0) {
            if (uVar10 < 3) {
              (*pamVar9)[uVar24] = (*pamVar9)[uVar24] + (short)uVar10;
              uVar11 = uVar29;
              do {
                uVar29 = uVar11 + 1;
                abStack_2b8[uVar11] = bVar28;
                uVar10 = uVar10 - 1;
                uVar11 = uVar29;
              } while (uVar10 != 0);
            }
            else {
              pmVar13 = d->m_huff_count[2] + 0x10;
              *pmVar13 = *pmVar13 + 1;
              uVar11 = uVar29 + 1;
              abStack_2b8[uVar29] = 0x10;
              uVar29 = uVar29 + 2;
              abStack_2b8[uVar11] = (char)uVar10 - 3;
            }
          }
          uVar18 = uVar18 + 1;
          if (uVar18 == 0x8a) {
            *pmVar1 = *pmVar1 + 1;
            abStack_2b8[uVar29] = 0x12;
            abStack_2b8[uVar29 + 1] = 0x7f;
LAB_00136643:
            uVar29 = uVar29 + 2;
            uVar10 = 0;
            goto LAB_00136646;
          }
          uVar10 = 0;
        }
        else {
          if (uVar18 != 0) {
            if (uVar18 < 3) {
              (*pamVar9)[0] = (*pamVar9)[0] + (short)uVar18;
              uVar11 = uVar29;
              do {
                uVar29 = uVar11 + 1;
                abStack_2b8[uVar11] = 0;
                uVar18 = uVar18 - 1;
                uVar11 = uVar29;
              } while (uVar18 != 0);
            }
            else {
              bVar30 = uVar18 < 0xb;
              pmVar13 = pmVar1;
              if (bVar30) {
                pmVar13 = pmVar2;
              }
              *pmVar13 = *pmVar13 + 1;
              abStack_2b8[uVar29] = 0x12 - bVar30;
              abStack_2b8[uVar29 + 1] = (bVar30 * '\b' + (char)uVar18) - 0xb;
              uVar29 = uVar29 + 2;
            }
          }
          if (bVar27 == bVar28) {
            uVar10 = uVar10 + 1;
            if (uVar10 == 6) {
              pmVar13 = d->m_huff_count[2] + 0x10;
              *pmVar13 = *pmVar13 + 1;
              abStack_2b8[uVar29] = 0x10;
              abStack_2b8[uVar29 + 1] = 3;
              goto LAB_00136643;
            }
LAB_00136646:
            uVar18 = 0;
          }
          else {
            if (uVar10 != 0) {
              if (uVar10 < 3) {
                (*pamVar9)[uVar24] = (*pamVar9)[uVar24] + (short)uVar10;
                uVar18 = uVar29;
                do {
                  uVar29 = uVar18 + 1;
                  abStack_2b8[uVar18] = bVar28;
                  uVar10 = uVar10 - 1;
                  uVar18 = uVar29;
                } while (uVar10 != 0);
              }
              else {
                pmVar13 = d->m_huff_count[2] + 0x10;
                *pmVar13 = *pmVar13 + 1;
                uVar18 = uVar29 + 1;
                abStack_2b8[uVar29] = 0x10;
                uVar29 = uVar29 + 2;
                abStack_2b8[uVar18] = (char)uVar10 - 3;
              }
            }
            uVar24 = (ulong)uVar29;
            (*pamVar9)[uVar22] = (*pamVar9)[uVar22] + 1;
            uVar29 = uVar29 + 1;
            abStack_2b8[uVar24] = bVar27;
            uVar10 = 0;
            uVar18 = 0;
          }
        }
        uVar26 = uVar26 + 1;
        uVar24 = uVar22;
      } while (uVar26 != (uint)(iVar17 + iVar16));
      if (uVar10 == 0) {
        if (uVar18 != 0) {
          if (uVar18 < 3) {
            (*pamVar9)[0] = (*pamVar9)[0] + (short)uVar18;
            uVar10 = uVar29;
            do {
              uVar29 = uVar10 + 1;
              abStack_2b8[uVar10] = 0;
              uVar18 = uVar18 - 1;
              uVar10 = uVar29;
            } while (uVar18 != 0);
          }
          else {
            if (uVar18 < 0xb) {
              *pmVar2 = *pmVar2 + 1;
              abStack_2b8[uVar29] = 0x11;
              bVar27 = (char)uVar18 - 3;
            }
            else {
              *pmVar1 = *pmVar1 + 1;
              abStack_2b8[uVar29] = 0x12;
              bVar27 = (char)uVar18 - 0xb;
            }
            abStack_2b8[uVar29 + 1] = bVar27;
            uVar29 = uVar29 + 2;
          }
        }
      }
      else if (uVar10 < 3) {
        (*pamVar9)[uVar22] = (*pamVar9)[uVar22] + (short)uVar10;
        uVar18 = uVar29;
        do {
          uVar29 = uVar18 + 1;
          abStack_2b8[uVar18] = bVar27;
          uVar10 = uVar10 - 1;
          uVar18 = uVar29;
        } while (uVar10 != 0);
      }
      else {
        pmVar1 = d->m_huff_count[2] + 0x10;
        *pmVar1 = *pmVar1 + 1;
        uVar18 = uVar29 + 1;
        abStack_2b8[uVar29] = 0x10;
        uVar29 = uVar29 + 2;
        abStack_2b8[uVar18] = (char)uVar10 - 3;
      }
    }
    tdefl_optimize_huffman_table(d,2,0x13,7,0);
    mVar25 = 2 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
    d->m_bit_buffer = mVar25;
    uVar10 = d->m_bits_in + 2;
    d->m_bits_in = uVar10;
    while (7 < uVar10) {
      pmVar21 = d->m_pOutput_buf;
      if (pmVar21 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar21 + 1;
        *pmVar21 = (mz_uint8)mVar25;
        uVar10 = d->m_bits_in;
        mVar25 = d->m_bit_buffer;
      }
      mVar25 = mVar25 >> 8;
      d->m_bit_buffer = mVar25;
      uVar10 = uVar10 - 8;
      d->m_bits_in = uVar10;
    }
    mVar25 = iVar16 + -0x101 << ((byte)uVar10 & 0x1f) | mVar25;
    d->m_bit_buffer = mVar25;
    uVar11 = uVar10 + 5;
    d->m_bits_in = uVar11;
    if (2 < uVar10) {
      do {
        pmVar21 = d->m_pOutput_buf;
        if (pmVar21 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar21 + 1;
          *pmVar21 = (mz_uint8)mVar25;
          uVar11 = d->m_bits_in;
          mVar25 = d->m_bit_buffer;
        }
        mVar25 = mVar25 >> 8;
        d->m_bit_buffer = mVar25;
        uVar11 = uVar11 - 8;
        d->m_bits_in = uVar11;
      } while (7 < uVar11);
    }
    uVar18 = iVar17 + -1 << ((byte)uVar11 & 0x1f) | mVar25;
    d->m_bit_buffer = uVar18;
    uVar15 = uVar11 + 5;
    d->m_bits_in = uVar15;
    if (2 < uVar11) {
      do {
        pmVar21 = d->m_pOutput_buf;
        if (pmVar21 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar21 + 1;
          *pmVar21 = (mz_uint8)uVar18;
          uVar15 = d->m_bits_in;
          uVar18 = d->m_bit_buffer;
        }
        uVar18 = uVar18 >> 8;
        d->m_bit_buffer = uVar18;
        uVar15 = uVar15 - 8;
        d->m_bits_in = uVar15;
      } while (7 < uVar15);
    }
    uVar10 = 0x12;
    do {
      if (d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar10]] != '\0') goto LAB_00136863;
      bVar30 = uVar10 != 0;
      uVar10 = uVar10 - 1;
    } while (bVar30);
    uVar10 = 0xffffffff;
LAB_00136863:
    uVar11 = 3;
    if (3 < (int)uVar10) {
      uVar11 = uVar10;
    }
    uVar18 = uVar11 - 3 << ((byte)uVar15 & 0x1f) | uVar18;
    d->m_bit_buffer = uVar18;
    uVar10 = uVar15 + 4;
    d->m_bits_in = uVar10;
    if (3 < uVar15) {
      do {
        pmVar21 = d->m_pOutput_buf;
        if (pmVar21 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar21 + 1;
          *pmVar21 = (mz_uint8)uVar18;
          uVar10 = d->m_bits_in;
          uVar18 = d->m_bit_buffer;
        }
        uVar18 = uVar18 >> 8;
        d->m_bit_buffer = uVar18;
        uVar10 = uVar10 - 8;
        d->m_bits_in = uVar10;
      } while (7 < uVar10);
    }
    uVar24 = 0;
    do {
      uVar18 = (uint)d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar24]] << ((byte)uVar10 & 0x1f) |
               uVar18;
      d->m_bit_buffer = uVar18;
      uVar15 = uVar10 + 3;
      d->m_bits_in = uVar15;
      bVar30 = 4 < uVar10;
      uVar10 = uVar15;
      if (bVar30) {
        do {
          pmVar21 = d->m_pOutput_buf;
          if (pmVar21 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar21 + 1;
            *pmVar21 = (mz_uint8)uVar18;
            uVar15 = d->m_bits_in;
            uVar18 = d->m_bit_buffer;
          }
          uVar18 = uVar18 >> 8;
          d->m_bit_buffer = uVar18;
          uVar15 = uVar15 - 8;
          d->m_bits_in = uVar15;
          uVar10 = uVar15;
        } while (7 < uVar15);
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != uVar11 + 1);
    if (uVar29 != 0) {
      uVar11 = 0;
      do {
        bVar27 = abStack_2b8[uVar11];
        bVar28 = d->m_huff_code_sizes[2][bVar27];
        uVar18 = (uint)d->m_huff_codes[2][bVar27] << ((byte)uVar10 & 0x1f) | uVar18;
        d->m_bit_buffer = uVar18;
        uVar10 = bVar28 + uVar10;
        d->m_bits_in = uVar10;
        while (7 < uVar10) {
          pmVar21 = d->m_pOutput_buf;
          if (pmVar21 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar21 + 1;
            *pmVar21 = (mz_uint8)uVar18;
            uVar10 = d->m_bits_in;
            uVar18 = d->m_bit_buffer;
          }
          uVar18 = uVar18 >> 8;
          d->m_bit_buffer = uVar18;
          uVar10 = uVar10 - 8;
          d->m_bits_in = uVar10;
        }
        uVar15 = uVar11 + 1;
        if (0xf < bVar27) {
          cVar3 = "\x02\x03\a"[bVar27 - 0x10];
          uVar18 = (uint)abStack_2b8[(ulong)uVar11 + 1] << ((byte)uVar10 & 0x1f) | uVar18;
          d->m_bit_buffer = uVar18;
          uVar10 = (int)cVar3 + uVar10;
          d->m_bits_in = uVar10;
          while (uVar15 = uVar11 + 2, 7 < uVar10) {
            pmVar21 = d->m_pOutput_buf;
            if (pmVar21 < d->m_pOutput_buf_end) {
              d->m_pOutput_buf = pmVar21 + 1;
              *pmVar21 = (mz_uint8)uVar18;
              uVar10 = d->m_bits_in;
              uVar18 = d->m_bit_buffer;
            }
            uVar18 = uVar18 >> 8;
            d->m_bit_buffer = uVar18;
            uVar10 = uVar10 - 8;
            d->m_bits_in = uVar10;
          }
        }
        uVar11 = uVar15;
      } while (uVar11 < uVar29);
    }
  }
  else {
    memset(d->m_huff_code_sizes,8,0x90);
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x90) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x91) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x92) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x93) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x94) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x95) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x96) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x97) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x98) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x99) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9a) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9b) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9c) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9d) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9e) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9f) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xaa) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xab) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xac) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xad) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xae) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xaf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xba) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbe) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 199) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 200) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xca) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xce) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xda) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xde) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xea) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xeb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xec) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xed) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xee) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xef) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfa) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfe) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xff) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x100) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x101) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x102) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x103) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x104) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x105) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x106) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x107) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x108) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x109) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10a) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10b) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10c) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10d) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10e) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10f) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x110) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x111) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x112) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x113) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x114) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x115) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x116) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x117) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x118) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x119) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11a) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11b) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11c) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11d) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11e) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11f) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 0) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 1) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 2) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 3) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 4) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 5) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 6) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 7) = '\x05';
    pamVar7 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar7 + 1) + 8) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 9) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 10) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0xb) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0xc) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0xd) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0xe) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0xf) = '\x05';
    pamVar7 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x10) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x11) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x12) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x13) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x14) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x15) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x16) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x17) = '\x05';
    pamVar7 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x18) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x19) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x1a) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x1b) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x1c) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x1d) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x1e) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x1f) = '\x05';
    tdefl_optimize_huffman_table(d,0,0x120,0xf,1);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,1);
    uVar18 = d->m_bit_buffer | 1 << (d->m_bits_in & 0x1f);
    d->m_bit_buffer = uVar18;
    uVar10 = d->m_bits_in + 2;
    d->m_bits_in = uVar10;
    while (7 < uVar10) {
      pmVar21 = d->m_pOutput_buf;
      if (pmVar21 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar21 + 1;
        *pmVar21 = (mz_uint8)uVar18;
        uVar10 = d->m_bits_in;
        uVar18 = d->m_bit_buffer;
      }
      uVar18 = uVar18 >> 8;
      d->m_bit_buffer = uVar18;
      uVar10 = uVar10 - 8;
      d->m_bits_in = uVar10;
    }
  }
  pbVar4 = d->m_pLZ_code_buf;
  puVar23 = (ulong *)d->m_pOutput_buf;
  uVar24 = (ulong)uVar18;
  pmVar21 = d->m_lz_code_buf;
  if (pmVar21 < pbVar4) {
    uVar26 = 1;
    do {
      pmVar20 = pmVar21;
      if ((int)uVar26 == 1) {
        pmVar20 = pmVar21 + 1;
        uVar26 = (ulong)(*pmVar21 | 0x100);
      }
      uVar29 = (uint)uVar26;
      uVar18 = uVar29;
      if ((uVar26 & 1) == 0) {
        pmVar21 = pmVar20 + 1;
        uVar24 = (ulong)d->m_huff_codes[0][*pmVar20] << ((byte)uVar10 & 0x3f) | uVar24;
        uVar10 = d->m_huff_code_sizes[0][*pmVar20] + uVar10;
        if (((uVar26 & 2) == 0) && (pmVar21 < pbVar4)) {
          uVar18 = (uint)(uVar26 >> 1);
          pmVar21 = pmVar20 + 2;
          uVar24 = uVar24 | (ulong)d->m_huff_codes[0][pmVar20[1]] << ((byte)uVar10 & 0x3f);
          uVar10 = uVar10 + d->m_huff_code_sizes[0][pmVar20[1]];
          if (((uVar26 & 4) == 0) && (pmVar21 < pbVar4)) {
            pmVar21 = pmVar20 + 3;
            uVar24 = uVar24 | (ulong)d->m_huff_codes[0][pmVar20[2]] << ((byte)uVar10 & 0x3f);
            uVar10 = uVar10 + d->m_huff_code_sizes[0][pmVar20[2]];
            uVar18 = uVar29 >> 2;
          }
        }
      }
      else {
        bVar27 = *pmVar20;
        iVar16 = d->m_huff_code_sizes[0][s_tdefl_len_sym[bVar27]] + uVar10;
        uVar29 = (uint)*(ushort *)(pmVar20 + 1);
        pmVar21 = pmVar20 + 3;
        iVar17 = iVar16 + (uint)""[bVar27];
        uVar5 = *(ushort *)(pmVar20 + 1) >> 8;
        pbVar14 = "" + uVar5;
        pbVar6 = "" + uVar5;
        if (uVar29 < 0x200) {
          pbVar14 = "" + (uVar29 & 0x1ff);
          pbVar6 = "" + (uVar29 & 0x1ff);
        }
        iVar19 = (uint)d->m_huff_code_sizes[1][*pbVar6] + iVar17;
        uVar24 = (ulong)(mz_bitmasks[""[bVar27]] & (uint)bVar27) << ((byte)iVar16 & 0x3f) |
                 (ulong)d->m_huff_codes[0][s_tdefl_len_sym[bVar27]] << ((byte)uVar10 & 0x3f) |
                 (ulong)d->m_huff_codes[1][*pbVar6] << ((byte)iVar17 & 0x3f) |
                 (ulong)(uVar29 & mz_bitmasks[*pbVar14]) << ((byte)iVar19 & 0x3f) | uVar24;
        uVar10 = iVar19 + (uint)*pbVar14;
      }
      if (d->m_pOutput_buf_end <= puVar23) {
        return 0;
      }
      *puVar23 = uVar24;
      puVar23 = (ulong *)((long)puVar23 + (ulong)(uVar10 >> 3));
      uVar24 = uVar24 >> ((byte)uVar10 & 0x38);
      uVar10 = uVar10 & 7;
      uVar26 = (ulong)(uVar18 >> 1);
    } while (pmVar21 < pbVar4);
  }
  d->m_pOutput_buf = (mz_uint8 *)puVar23;
  if (uVar10 == 0) {
    mVar25 = 0;
    uVar18 = 0;
  }
  else {
    mVar25 = 0;
    uVar18 = 0;
    do {
      uVar26 = 0x10;
      if (uVar10 < 0x10) {
        uVar26 = (ulong)uVar10;
      }
      mVar25 = (mz_bitmasks[uVar26] & (uint)uVar24) << ((byte)uVar18 & 0x1f) | mVar25;
      d->m_bit_buffer = mVar25;
      uVar18 = (int)uVar26 + uVar18;
      d->m_bits_in = uVar18;
      while (7 < uVar18) {
        pmVar21 = d->m_pOutput_buf;
        if (pmVar21 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar21 + 1;
          *pmVar21 = (mz_uint8)mVar25;
          uVar18 = d->m_bits_in;
          mVar25 = d->m_bit_buffer;
        }
        mVar25 = mVar25 >> 8;
        d->m_bit_buffer = mVar25;
        uVar18 = uVar18 - 8;
        d->m_bits_in = uVar18;
      }
      uVar24 = uVar24 >> ((byte)uVar26 & 0x3f);
      uVar10 = uVar10 - (int)uVar26;
    } while (uVar10 != 0);
  }
  bVar27 = d->m_huff_code_sizes[0][0x100];
  uVar10 = (uint)d->m_huff_codes[0][0x100] << ((byte)uVar18 & 0x1f) | mVar25;
  d->m_bit_buffer = uVar10;
  uVar18 = bVar27 + uVar18;
  d->m_bits_in = uVar18;
  while (7 < uVar18) {
    pmVar21 = d->m_pOutput_buf;
    if (pmVar21 < d->m_pOutput_buf_end) {
      d->m_pOutput_buf = pmVar21 + 1;
      *pmVar21 = (mz_uint8)uVar10;
      uVar18 = d->m_bits_in;
      uVar10 = d->m_bit_buffer;
    }
    uVar10 = uVar10 >> 8;
    d->m_bit_buffer = uVar10;
    uVar18 = uVar18 - 8;
    d->m_bits_in = uVar18;
  }
  return (uint)(d->m_pOutput_buf < d->m_pOutput_buf_end);
}

Assistant:

static mz_bool tdefl_compress_block(tdefl_compressor* d, mz_bool static_block) {
  if (static_block)
    tdefl_start_static_block(d);
  else
    tdefl_start_dynamic_block(d);
  return tdefl_compress_lz_codes(d);
}